

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fop.c
# Opt level: O1

Qiniu_Error
Qiniu_FOP_Pfop(Qiniu_Client *self,Qiniu_FOP_PfopRet *ret,char *bucket,char *key,char **fops,
              int fopCount,char *pipeline,char *notifyURL,int force)

{
  Qiniu_Error QVar1;
  Qiniu_FOP_PfopParams local_48;
  
  local_48.workflowTemplateID = (char *)0x0;
  local_48.type = 0;
  local_48._60_4_ = 0;
  local_48.pipeline = pipeline;
  local_48.notifyURL = notifyURL;
  local_48.force = force;
  local_48.fopCount = fopCount;
  local_48.bucket = bucket;
  local_48.key = key;
  local_48.fops = fops;
  QVar1 = Qiniu_FOP_Pfop_v2(self,ret,&local_48);
  return QVar1;
}

Assistant:

Qiniu_Error Qiniu_FOP_Pfop(Qiniu_Client *self, Qiniu_FOP_PfopRet *ret, const char *bucket, const char *key,
                           char *fops[], int fopCount, const char *pipeline, const char *notifyURL, int force)
{
    Qiniu_FOP_PfopParams params;
    Qiniu_Zero(params);
    params.bucket = bucket;
    params.key = key;
    params.fops = (char **)fops;
    params.fopCount = fopCount;
    params.pipeline = pipeline;
    params.notifyURL = notifyURL;
    params.force = force;
    return Qiniu_FOP_Pfop_v2(self, ret, &params);
}